

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void PresentScreen(void)

{
  QueuedOverlayItem *pQVar1;
  SDL_Renderer *pSVar2;
  SDL_GLContext pvVar3;
  QueuedOverlayItem *pQVar4;
  SDL_Rect dstrect20;
  SDL_Rect local_30;
  
  (*SDL20_LockMutex)(VideoRendererLock);
  pSVar2 = VideoRenderer20;
  if (VideoRenderer20 != (SDL_Renderer *)0x0) {
    if (EventThreadEnabled != SDL_FALSE) {
      SDL_PumpEvents();
    }
    (*SDL20_RenderClear)(pSVar2);
    (*SDL20_RenderCopy)(pSVar2,VideoTexture20,(SDL_Rect *)0x0,(SDL_Rect *)0x0);
    if (QueuedDisplayOverlays.next != (QueuedOverlayItem *)0x0) {
      pQVar4 = QueuedDisplayOverlays.next;
      do {
        pQVar1 = pQVar4->next;
        if (pQVar4->overlay12 != (SDL12_Overlay *)0x0) {
          local_30.x = (int)(pQVar4->dstrect12).x;
          local_30.y = (int)(pQVar4->dstrect12).y;
          local_30.w = (int)(pQVar4->dstrect12).w;
          local_30.h = (int)(pQVar4->dstrect12).h;
          (*SDL20_RenderCopy)(pSVar2,*pQVar4->overlay12->hwdata,(SDL_Rect *)0x0,&local_30);
        }
        (*SDL20_free)(pQVar4);
        pQVar4 = pQVar1;
      } while (pQVar1 != (QueuedOverlayItem *)0x0);
      QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
      QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }
    (*SDL20_RenderPresent)(pSVar2);
    VideoSurfaceUpdatedInBackgroundThread = 0;
    VideoSurfaceLastPresentTicks = (*SDL20_GetTicks)();
    VideoSurfacePresentTicks = 0;
    if (VideoRenderer20 != (SDL_Renderer *)0x0) {
      pvVar3 = (*SDL20_GL_GetCurrentContext)();
      if (pvVar3 != (SDL_GLContext)0x0) {
        (*SDL20_GL_MakeCurrent)((SDL_Window *)0x0,(SDL_GLContext)0x0);
      }
    }
    (*SDL20_UnlockMutex)(VideoRendererLock);
  }
  return;
}

Assistant:

static void
PresentScreen(void)
{
    QueuedOverlayItem *overlay;
    SDL_Renderer *renderer = LockVideoRenderer();

    if (!renderer) {
        return;
    }

    /* We don't actually implement an event thread in sdl12-compat, but some
     * games will only call SDL_PeepEvents(), which doesn't otherwise pump
     * events, and get stuck when they've consumed all the events.
     *
     * Just pumping the event loop here simulates an event thread well enough
     * for most things.
     */
    if (EventThreadEnabled) {
        SDL_PumpEvents();
    }

    SDL20_RenderClear(renderer);
    SDL20_RenderCopy(renderer, VideoTexture20, NULL, NULL);

    /* Render any pending YUV overlay over the surface texture. */
    overlay = QueuedDisplayOverlays.next;
    if (overlay) {
        while (overlay != NULL) {
            QueuedOverlayItem *next = overlay->next;
            if (overlay->overlay12) {
                SDL12_YUVData *hwdata = (SDL12_YUVData *) overlay->overlay12->hwdata;
                SDL_Rect dstrect20;
                SDL20_RenderCopy(renderer, hwdata->texture20, NULL, Rect12to20(&overlay->dstrect12, &dstrect20));
            }
            SDL_free(overlay);
            overlay = next;
        }
        QueuedDisplayOverlays.next = NULL;
        QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }

    SDL20_RenderPresent(renderer);
    VideoSurfaceUpdatedInBackgroundThread = SDL_FALSE;
    VideoSurfaceLastPresentTicks = SDL20_GetTicks();
    VideoSurfacePresentTicks = 0;

    UnlockVideoRenderer();
}